

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::vSolveLright2
          (CLUFactor<double> *this,double *vec,int *ridx,int *rn,double eps,double *vec2,int *ridx2,
          int *rn2,double eps2)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  CLUFactor<double> *in_RDI;
  long in_R8;
  int *in_R9;
  int *in_stack_00000008;
  StableSum<double> tmp2;
  StableSum<double> tmp1;
  int *lbeg;
  int *idx;
  int *lidx;
  int *lrow;
  double *val;
  double *lval;
  double x2;
  double x;
  int end;
  int n;
  int k;
  int j;
  int i;
  double in_stack_ffffffffffffff38;
  StableSum<double> local_b8;
  StableSum<double> local_a8;
  int *local_98;
  int *local_90;
  int *local_88;
  int *local_80;
  double *local_78;
  double *local_70;
  double local_68;
  double local_60;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int *local_38;
  long local_30;
  int *local_20;
  int *local_18;
  long local_10;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_70 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x29587b);
  local_88 = (in_RDI->l).idx;
  local_80 = (in_RDI->l).row;
  local_98 = (in_RDI->l).start;
  local_54 = (in_RDI->l).firstUpdate;
  for (local_44 = 0; local_44 < local_54; local_44 = local_44 + 1) {
    local_48 = local_80[local_44];
    local_68 = *(double *)(local_30 + (long)local_48 * 8);
    local_60 = *(double *)(local_10 + (long)local_48 * 8);
    bVar3 = isNotZero<double,double>((double)in_RDI,in_stack_ffffffffffffff38);
    if (bVar3) {
      local_4c = local_98[local_44];
      local_90 = local_88 + local_4c;
      local_78 = local_70 + local_4c;
      bVar3 = isNotZero<double,double>((double)in_RDI,in_stack_ffffffffffffff38);
      if (bVar3) {
        for (local_48 = local_98[local_44 + 1]; local_4c < local_48; local_48 = local_48 + -1) {
          local_50 = *local_90;
          local_90 = local_90 + 1;
          updateSolutionVectorLright
                    (in_RDI,local_60 * *local_78,local_50,(double *)(local_10 + (long)local_50 * 8),
                     local_18,local_20);
          updateSolutionVectorLright
                    (in_RDI,local_68 * *local_78,local_50,(double *)(local_30 + (long)local_50 * 8),
                     local_38,in_stack_00000008);
          local_78 = local_78 + 1;
        }
      }
      else {
        for (local_48 = local_98[local_44 + 1]; local_4c < local_48; local_48 = local_48 + -1) {
          local_50 = *local_90;
          local_90 = local_90 + 1;
          updateSolutionVectorLright
                    (in_RDI,local_60 * *local_78,local_50,(double *)(local_10 + (long)local_50 * 8),
                     local_18,local_20);
          local_78 = local_78 + 1;
        }
      }
    }
    else {
      bVar3 = isNotZero<double,double>((double)in_RDI,in_stack_ffffffffffffff38);
      if (bVar3) {
        local_4c = local_98[local_44];
        local_90 = local_88 + local_4c;
        local_78 = local_70 + local_4c;
        for (local_48 = local_98[local_44 + 1]; local_4c < local_48; local_48 = local_48 + -1) {
          local_50 = *local_90;
          local_90 = local_90 + 1;
          updateSolutionVectorLright
                    (in_RDI,local_68 * *local_78,local_50,(double *)(local_30 + (long)local_50 * 8),
                     local_38,in_stack_00000008);
          local_78 = local_78 + 1;
        }
      }
    }
  }
  if ((in_RDI->l).updateType != 0) {
    local_54 = (in_RDI->l).firstUnused;
    for (; local_44 < local_54; local_44 = local_44 + 1) {
      local_4c = local_98[local_44];
      local_90 = local_88 + local_4c;
      local_78 = local_70 + local_4c;
      StableSum<double>::StableSum(&local_a8);
      StableSum<double>::StableSum(&local_b8);
      for (local_48 = local_98[local_44 + 1]; local_4c < local_48; local_48 = local_48 + -1) {
        StableSum<double>::operator+=
                  (&local_a8,*(double *)(local_10 + (long)*local_90 * 8) * *local_78);
        iVar2 = *local_90;
        dVar1 = *local_78;
        local_90 = local_90 + 1;
        local_78 = local_78 + 1;
        StableSum<double>::operator+=(&local_b8,*(double *)(local_30 + (long)iVar2 * 8) * dVar1);
      }
      local_60 = StableSum::operator_cast_to_double((StableSum *)&local_a8);
      local_68 = StableSum::operator_cast_to_double((StableSum *)&local_b8);
      local_48 = local_80[local_44];
      bVar3 = isNotZero<double,double>((double)in_RDI,in_stack_ffffffffffffff38);
      if (bVar3) {
        updateSolutionVectorLright
                  (in_RDI,local_60,local_48,(double *)(local_10 + (long)local_48 * 8),local_18,
                   local_20);
      }
      bVar3 = isNotZero<double,double>((double)in_RDI,in_stack_ffffffffffffff38);
      if (bVar3) {
        updateSolutionVectorLright
                  (in_RDI,local_68,local_48,(double *)(local_30 + (long)local_48 * 8),local_38,
                   in_stack_00000008);
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright2(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2)
{
   int i, j, k, n;
   int end;
   R x, x2;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x2 = vec2[j];
      x = vec[j];

      // check whether there is a corresponding value in the first rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // check whether there is  also a corresponding value in the second rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
         if(isNotZero(x2, eps2))
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
         // only the first VectorBase<R> needs to be modified
         else
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      // only the second VectorBase<R> needs to be modified
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);
      }
   }
}